

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltimerquery.cpp
# Opt level: O1

void __thiscall QOpenGLTimeMonitor::QOpenGLTimeMonitor(QOpenGLTimeMonitor *this,QObject *parent)

{
  QObjectPrivate *pQVar1;
  
  pQVar1 = (QObjectPrivate *)operator_new(0xd0);
  QObjectPrivate::QObjectPrivate(pQVar1,0x60a00);
  *(undefined ***)pQVar1 = &PTR__QOpenGLTimeMonitorPrivate_001a32c0;
  *(undefined8 *)(pQVar1 + 0x78) = 0;
  *(undefined8 *)(pQVar1 + 0x80) = 0;
  *(undefined8 *)(pQVar1 + 0x88) = 0;
  *(undefined8 *)(pQVar1 + 0x90) = 0;
  *(undefined8 *)(pQVar1 + 0x98) = 0;
  *(undefined8 *)(pQVar1 + 0xa0) = 0;
  *(undefined8 *)(pQVar1 + 0xa8) = 0;
  *(undefined8 *)(pQVar1 + 0xb0) = 0;
  *(undefined8 *)(pQVar1 + 0xb8) = 0;
  *(undefined8 *)(pQVar1 + 0xc0) = 0xffffffff00000002;
  pQVar1[200] = (QObjectPrivate)0x0;
  QObject::QObject(&this->super_QObject,pQVar1,parent);
  *(undefined ***)this = &PTR_metaObject_001a3158;
  return;
}

Assistant:

QOpenGLTimeMonitor::QOpenGLTimeMonitor(QObject *parent)
    : QObject(*new QOpenGLTimeMonitorPrivate, parent)
{
}